

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

bool __thiscall
testing::
PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&>::MatchAndExplain
          (MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this,
          vector<char,_std::allocator<char>_> *x,MatchResultListener *listener)

{
  pointer __s2;
  ulong __n;
  int iVar1;
  bool bVar2;
  
  __s2 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start;
  __n = (this->impl_).predicate_.expected_._M_string_length;
  if ((ulong)((long)(x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__s2) < __n) {
    bVar2 = false;
  }
  else if (__n == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp((this->impl_).predicate_.expected_._M_dataplus._M_p,__s2,__n);
    bVar2 = iVar1 == 0;
  }
  if (bVar2 == false) {
    MatchResultListener::operator<<(listener,(char (*) [35])"didn\'t satisfy the given predicate");
  }
  return bVar2;
}

Assistant:

bool MatchAndExplain(T x, MatchResultListener* listener) const override {
      return impl_.MatchAndExplain(x, listener);
    }